

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<short,_int,_duckdb::ParquetCastOperator>::FlushDictionary
          (StandardColumnWriter<short,_int,_duckdb::ParquetCastOperator> *this,
          PrimitiveColumnWriterState *state_p,ColumnWriterStatistics *stats)

{
  pointer num_entries;
  ParquetBloomFilter *this_00;
  undefined1 local_60 [24];
  function<void_(const_short_&,_const_int_&)> local_48;
  
  num_entries = state_p[1].super_ColumnWriterState.repetition_levels.
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_60._8_8_ =
       ((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
       bloom_filter_false_positive_ratio;
  local_60._16_8_ = stats;
  this_00 = (ParquetBloomFilter *)operator_new(0x10);
  ParquetBloomFilter::ParquetBloomFilter(this_00,(idx_t)num_entries,(double)local_60._8_8_);
  ::std::
  __uniq_ptr_impl<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>::
  reset((__uniq_ptr_impl<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>
         *)&state_p->bloom_filter,this_00);
  local_48.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)(local_60 + 0x10);
  local_48._M_invoker =
       ::std::
       _Function_handler<void_(const_short_&,_const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/extension/parquet/include/writer/templated_column_writer.hpp:290:34)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(const_short_&,_const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/extension/parquet/include/writer/templated_column_writer.hpp:290:34)>
       ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = state_p;
  PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator>::IterateValues<short,_0>
            ((PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *)
             &state_p[1].super_ColumnWriterState.definition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator>::GetTargetMemoryStream
            ((PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *)local_60);
  PrimitiveColumnWriter::WriteDictionary
            (&this->super_PrimitiveColumnWriter,state_p,
             (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             local_60,(idx_t)state_p[1].super_ColumnWriterState.repetition_levels.
                             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
  if ((Allocator *)local_60._0_8_ != (Allocator *)0x0) {
    (**(code **)(*(allocate_function_ptr_t *)local_60._0_8_ + 0x10))();
  }
  return;
}

Assistant:

void FlushDictionary(PrimitiveColumnWriterState &state_p, ColumnWriterStatistics *stats) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		D_ASSERT(state.encoding == duckdb_parquet::Encoding::RLE_DICTIONARY);

		state.bloom_filter =
		    make_uniq<ParquetBloomFilter>(state.dictionary.GetSize(), writer.BloomFilterFalsePositiveRatio());

		state.dictionary.IterateValues([&](const SRC &src_value, const TGT &tgt_value) {
			// update the statistics
			OP::template HandleStats<SRC, TGT>(stats, tgt_value);
			// update the bloom filter
			auto hash = OP::template XXHash64<SRC, TGT>(tgt_value);
			state.bloom_filter->FilterInsert(hash);
		});

		// flush the dictionary page and add it to the to-be-written pages
		WriteDictionary(state, state.dictionary.GetTargetMemoryStream(), state.dictionary.GetSize());
		// bloom filter will be queued for writing in ParquetWriter::BufferBloomFilter one level up
	}